

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrule.cpp
# Opt level: O1

void __thiscall
icu_63::DateTimeRule::DateTimeRule
          (DateTimeRule *this,int32_t month,int32_t dayOfMonth,int32_t dayOfWeek,UBool after,
          int32_t millisInDay,TimeRuleType timeType)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DateTimeRule_00477fc8;
  this->fMonth = month;
  this->fDayOfMonth = dayOfMonth;
  this->fDayOfWeek = dayOfWeek;
  this->fWeekInMonth = 0;
  this->fMillisInDay = millisInDay;
  this->fTimeRuleType = timeType;
  this->fDateRuleType = (after == '\0') + DOW_GEQ_DOM;
  return;
}

Assistant:

DateTimeRule::DateTimeRule(int32_t month,
                           int32_t dayOfMonth,
                           int32_t dayOfWeek,
                           UBool after,
                           int32_t millisInDay,
                           TimeRuleType timeType)
: UObject(),
  fMonth(month), fDayOfMonth(dayOfMonth), fDayOfWeek(dayOfWeek), fWeekInMonth(0), fMillisInDay(millisInDay),
  fTimeRuleType(timeType) {
    if (after) {
        fDateRuleType = DateTimeRule::DOW_GEQ_DOM;
    } else {
        fDateRuleType = DateTimeRule::DOW_LEQ_DOM;
    }
}